

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deal.cpp
# Opt level: O0

int __thiscall Deal::scoreIfWon(Deal *this,int nbrOfOddTricks)

{
  int iVar1;
  Type TVar2;
  int local_1c;
  int local_18;
  int contractPoints;
  int slamBonus;
  int nbrOfOddTricks_local;
  Deal *this_local;
  
  local_1c = 0;
  iVar1 = Contract::getTricksAmount(this->_contract);
  if (iVar1 == 6) {
    local_18 = 500;
  }
  else if (iVar1 == 7) {
    local_18 = 1000;
  }
  else {
    local_18 = 0;
  }
  TVar2 = Contract::getColor(this->_contract);
  if (TVar2 < HEART) {
    local_1c = nbrOfOddTricks * 0x14;
  }
  else if (TVar2 - HEART < 2) {
    local_1c = nbrOfOddTricks * 0x1e;
  }
  else if (TVar2 == NOTRUMP) {
    local_1c = nbrOfOddTricks * 0x1e + 10;
  }
  return local_1c + local_18;
}

Assistant:

int Deal::scoreIfWon(int nbrOfOddTricks) {
    int slamBonus;
    int contractPoints = 0;

    switch (_contract->getTricksAmount()) {
        case 6:
            slamBonus = 500;
            break;
        case 7:
            slamBonus = 1000;
            break;
        default :
            slamBonus = 0;
            break;
    }

    switch (_contract->getColor()) {
        case Color::CLUB:
        case Color::DIAMOND:
            contractPoints = 20 * nbrOfOddTricks;
            break;
        case Color::HEART:
        case Color::SPADE:
            contractPoints = 30 * nbrOfOddTricks;
            break;
        case Color::NOTRUMP:
            contractPoints = 10 + 30 * nbrOfOddTricks;
            break;
    }

    return contractPoints + slamBonus;
}